

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O3

void __thiscall
IGNOREMockCallTest_testForPerformanceProfiling_Test::testBody
          (IGNOREMockCallTest_testForPerformanceProfiling_Test *this)

{
  MockSupport *pMVar1;
  int iVar2;
  SimpleString local_50;
  SimpleString local_40;
  
  SimpleString::SimpleString(&local_40,"");
  pMVar1 = mock(&local_40,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_50,"SimpleFunction");
  iVar2 = 2000;
  (*pMVar1->_vptr_MockSupport[5])(pMVar1,2000,&local_50);
  SimpleString::~SimpleString(&local_50);
  SimpleString::~SimpleString(&local_40);
  do {
    SimpleString::SimpleString(&local_40,"");
    pMVar1 = mock(&local_40,(MockFailureReporter *)0x0);
    SimpleString::SimpleString(&local_50,"SimpleFunction");
    (*pMVar1->_vptr_MockSupport[6])(pMVar1,&local_50);
    SimpleString::~SimpleString(&local_50);
    SimpleString::~SimpleString(&local_40);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return;
}

Assistant:

IGNORE_TEST(MockCallTest, testForPerformanceProfiling)
{
    /* TO fix! */
    mock().expectNCalls(2000, "SimpleFunction");
    for (int i = 0; i < 2000; i++) {
        mock().actualCall("SimpleFunction");
    }
}